

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sms_Apu.cpp
# Opt level: O3

void __thiscall Sms_Apu::reset(Sms_Apu *this,uint feedback,int noise_width)

{
  Blip_Buffer *pBVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  iVar2 = 0x10;
  if (feedback != 0 && noise_width != 0) {
    iVar2 = noise_width;
  }
  uVar4 = 9;
  if (feedback != 0 && noise_width != 0) {
    uVar4 = (ulong)feedback;
  }
  this->last_time = 0;
  this->latch = 0;
  this->looped_feedback = 1 << ((char)iVar2 - 1U & 0x1f);
  uVar3 = 0;
  do {
    uVar5 = (uint)uVar4;
    uVar4 = uVar4 >> 1;
    uVar3 = (uVar5 & 1) + uVar3 * 2;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  this->noise_feedback = uVar3;
  this->squares[0].super_Sms_Osc.delay = 0;
  this->squares[0].super_Sms_Osc.last_amp = 0;
  *(undefined8 *)&this->squares[0].super_Sms_Osc.volume = 0;
  this->squares[0].phase = 0;
  this->squares[0].super_Sms_Osc.output_select = 3;
  pBVar1 = this->squares[1].super_Sms_Osc.outputs[3];
  this->squares[0].super_Sms_Osc.output = this->squares[0].super_Sms_Osc.outputs[3];
  this->squares[1].super_Sms_Osc.delay = 0;
  this->squares[1].super_Sms_Osc.last_amp = 0;
  *(undefined8 *)&this->squares[1].super_Sms_Osc.volume = 0;
  this->squares[1].phase = 0;
  this->squares[1].super_Sms_Osc.output_select = 3;
  this->squares[1].super_Sms_Osc.output = pBVar1;
  this->squares[2].super_Sms_Osc.delay = 0;
  this->squares[2].super_Sms_Osc.last_amp = 0;
  *(undefined8 *)&this->squares[2].super_Sms_Osc.volume = 0;
  this->squares[2].phase = 0;
  this->squares[2].super_Sms_Osc.output_select = 3;
  this->squares[2].super_Sms_Osc.output = this->squares[2].super_Sms_Osc.outputs[3];
  (this->noise).period = noise_periods;
  (this->noise).shifter = 0x8000;
  (this->noise).feedback = 0x9000;
  (this->noise).super_Sms_Osc.output_select = 3;
  (this->noise).super_Sms_Osc.delay = 0;
  (this->noise).super_Sms_Osc.last_amp = 0;
  (this->noise).super_Sms_Osc.volume = 0;
  (this->noise).super_Sms_Osc.output = (this->noise).super_Sms_Osc.outputs[3];
  return;
}

Assistant:

void Sms_Apu::reset( unsigned feedback, int noise_width )
{
	last_time = 0;
	latch = 0;
	
	if ( !feedback || !noise_width )
	{
		feedback = 0x0009;
		noise_width = 16;
	}
	// convert to "Galios configuration"
	looped_feedback = 1 << (noise_width - 1);
	noise_feedback  = 0;
	while ( noise_width-- )
	{
		noise_feedback = (noise_feedback << 1) | (feedback & 1);
		feedback >>= 1;
	}
	
	squares [0].reset();
	squares [1].reset();
	squares [2].reset();
	noise.reset();
}